

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O3

bool duckdb::SkipToClose(StringCastInputState *input_state)

{
  byte bVar1;
  ulong *puVar2;
  ulong *puVar3;
  byte *pbVar4;
  ulong uVar5;
  bool bVar6;
  vector<char,_true> brackets;
  char local_49;
  vector<char,_std::allocator<char>_> local_48;
  
  puVar2 = input_state->pos;
  puVar3 = input_state->len;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (char *)0x0;
  uVar5 = *puVar2;
  if (uVar5 < *puVar3) {
    do {
      bVar1 = input_state->buf[uVar5];
      if (bVar1 < 0x28) {
        if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
          if ((input_state->escaped != false) || (bVar6 = SkipToCloseQuotes(input_state), bVar6))
          goto LAB_012c91b0;
          break;
        }
LAB_012c9155:
        pbVar4 = (byte *)vector<char,_true>::back((vector<char,_true> *)&local_48);
        if (bVar1 == *pbVar4) {
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
          if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_012c91b0;
          bVar6 = true;
          goto LAB_012c91d1;
        }
        bVar6 = input_state->buf[*puVar2] == '\\';
      }
      else {
        if (bVar1 == 0x28) {
          local_49 = ')';
          if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                      (&local_48,
                       (iterator)
                       local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_49);
          }
          else {
            *local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = ')';
LAB_012c914e:
            local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
        }
        else if (bVar1 == 0x5b) {
          local_49 = ']';
          if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = ']';
            goto LAB_012c914e;
          }
          ::std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                    (&local_48,
                     (iterator)
                     local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_49);
        }
        else {
          if (bVar1 != 0x7b) goto LAB_012c9155;
          local_49 = '}';
          if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish = '}';
            goto LAB_012c914e;
          }
          ::std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                    (&local_48,
                     (iterator)
                     local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_49);
        }
LAB_012c91b0:
        bVar6 = false;
      }
      input_state->escaped = bVar6;
      uVar5 = *puVar2 + 1;
      *puVar2 = uVar5;
    } while (uVar5 < *puVar3);
    bVar6 = false;
LAB_012c91d1:
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool SkipToClose(StringCastInputState &input_state) {
	auto &idx = input_state.pos;
	auto &buf = input_state.buf;
	auto &len = input_state.len;

	D_ASSERT(buf[idx] == '{' || buf[idx] == '[' || buf[idx] == '(');

	vector<char> brackets;
	while (idx < len) {
		bool set_escaped = false;
		if (buf[idx] == '"' || buf[idx] == '\'') {
			if (!input_state.escaped) {
				if (!SkipToCloseQuotes(input_state)) {
					return false;
				}
			}
		} else if (buf[idx] == '{') {
			brackets.push_back('}');
		} else if (buf[idx] == '(') {
			brackets.push_back(')');
		} else if (buf[idx] == '[') {
			brackets.push_back(']');
		} else if (buf[idx] == brackets.back()) {
			brackets.pop_back();
			if (brackets.empty()) {
				return true;
			}
		} else if (buf[idx] == '\\') {
			//! Note that we don't treat `\\` special here, backslashes can't be escaped outside of quotes
			//! backslashes within quotes will not be encountered in this function
			set_escaped = true;
		}
		input_state.escaped = set_escaped;
		idx++;
	}
	return false;
}